

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_writer_flush_message(mpack_writer_t *writer)

{
  size_t sVar1;
  mpack_writer_t *writer_local;
  
  if (writer->error == mpack_ok) {
    if (writer->flush == (mpack_writer_flush_t)0x0) {
      mpack_writer_flag_error(writer,mpack_error_bug);
    }
    else {
      sVar1 = mpack_writer_buffer_used(writer);
      if (sVar1 != 0) {
        mpack_writer_flush_unchecked(writer);
      }
    }
  }
  return;
}

Assistant:

void mpack_writer_flush_message(mpack_writer_t* writer) {
    if (writer->error != mpack_ok)
        return;

    #if MPACK_WRITE_TRACKING
    mpack_writer_flag_if_error(writer, mpack_track_check_empty(&writer->track));
    if (writer->error != mpack_ok)
        return;
    #endif

    if (writer->flush == NULL) {
        mpack_break("cannot call mpack_writer_flush_message() without a flush function!");
        mpack_writer_flag_error(writer, mpack_error_bug);
        return;
    }

    if (mpack_writer_buffer_used(writer) > 0)
        mpack_writer_flush_unchecked(writer);
}